

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O2

DataType deqp::gles3::Functional::FboTestUtil::getFragmentOutputType(TextureFormat *format)

{
  TextureChannelClass TVar1;
  DataType DVar2;
  
  TVar1 = tcu::getTextureChannelClass(format->type);
  if (TVar1 < TEXTURECHANNELCLASS_LAST) {
    DVar2 = *(DataType *)(&DAT_009f2534 + (ulong)TVar1 * 4);
  }
  else {
    DVar2 = TYPE_LAST;
  }
  return DVar2;
}

Assistant:

glu::DataType getFragmentOutputType (const tcu::TextureFormat& format)
{
	switch (tcu::getTextureChannelClass(format.type))
	{
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			return glu::TYPE_FLOAT_VEC4;

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			return glu::TYPE_UINT_VEC4;

		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			return glu::TYPE_INT_VEC4;

		default:
			DE_FATAL("Unknown format");
			return glu::TYPE_LAST;
	}
}